

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O1

output_type *
dnet::data_types::vec_flater<int,_2U>::flatten(output_type *__return_storage_ptr__,input_type *arr)

{
  pointer pvVar1;
  pointer piVar2;
  pointer piVar3;
  pointer __x;
  vector<int,_std::allocator<int>_> a;
  vector<int,_std::allocator<int>_> local_68;
  vector<int,_std::allocator<int>_> local_48;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __x = (arr->
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (arr->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__x != pvVar1) {
    do {
      std::vector<int,_std::allocator<int>_>::vector(&local_48,__x);
      std::vector<int,_std::allocator<int>_>::vector(&local_68,&local_48);
      piVar3 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      piVar2 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<int,std::allocator<int>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((vector<int,std::allocator<int>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish,piVar2,piVar3);
      if (piVar2 != (pointer)0x0) {
        operator_delete(piVar2);
      }
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      __x = __x + 1;
    } while (__x != pvVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

static output_type flatten(input_type arr)
            {
                std::vector<T> ret;
                for (auto a : arr) {
                    std::vector<T> res = vec_flater<T, N - 1>::flatten(a);
                    ret.insert(ret.end(), res.begin(), res.end());
                }
                return ret;
            }